

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  string currentStart;
  string msg;
  string local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  undefined1 local_190 [16];
  _func_int *local_180 [12];
  ios_base local_120 [264];
  
  InitializeFromParent(mf,this);
  pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&mf->StateSnapshot);
  std::__cxx11::string::string((string *)&local_1b0,pcVar3,(allocator *)local_190);
  if (this->LocalGenerator->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    local_190._0_8_ = local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"   Entering             ","");
    std::__cxx11::string::_M_append(local_190,(ulong)local_1b0);
    cmSystemTools::Message((char *)local_190._0_8_,(char *)0x0);
    if ((_func_int **)local_190._0_8_ != local_180) {
      operator_delete((void *)local_190._0_8_,(ulong)(local_180[0] + 1));
    }
  }
  std::__cxx11::string::append((char *)&local_1b0);
  bVar1 = cmsys::SystemTools::FileExists((char *)local_1b0,true);
  if (bVar1) {
    Configure(mf);
    if (this->LocalGenerator->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      local_190._0_8_ = local_180;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_190,"   Returning to         ","");
      cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
      std::__cxx11::string::append(local_190);
      cmSystemTools::Message((char *)local_190._0_8_,(char *)0x0);
      if ((_func_int **)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_,(ulong)(local_180[0] + 1));
      }
    }
    goto LAB_00368aa6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"The source directory\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"  ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1b0,local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"does not contain a CMakeLists.txt file.",0x27);
  PVar2 = GetPolicyStatus(this,CMP0014);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1d0,(cmPolicies *)0xe,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
LAB_00368a45:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_00368a74:
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar2 == WARN) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"CMake does not support this case but it used ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"to work accidentally and is being allowed for ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"compatibility.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0xe,id_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    IssueMessage(this,AUTHOR_WARNING,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_00368a74;
  }
  else if (PVar2 == NEW) goto LAB_00368a45;
  mf->Configured = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
LAB_00368aa6:
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile *mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Entering             ";
    msg += currentStart;
    cmSystemTools::Message(msg.c_str());
    }

  currentStart += "/CMakeLists.txt";
  if(!cmSystemTools::FileExists(currentStart.c_str(), true))
    {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    switch (this->GetPolicyStatus(cmPolicies::CMP0014))
      {
      case cmPolicies::WARN:
        // Print the warning.
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n"
          << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    mf->SetConfigured();
    return;
    }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Returning to         ";
    msg += this->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str());
    }
}